

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Arg * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::parse_arg_name
          (BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **s)

{
  long lVar1;
  CStringRef message;
  bool bVar2;
  FormatError *this_00;
  long *in_RDX;
  char **in_RSI;
  Arg *in_RDI;
  char *error;
  Char c;
  Char *start;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 uVar3;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *in_stack_ffffffffffffffb0;
  BasicStringRef<char> in_stack_ffffffffffffffb8;
  BasicStringRef<char> local_38;
  char *local_28;
  char local_19;
  char *local_18;
  long *local_10;
  
  local_18 = (char *)*in_RDX;
  local_10 = in_RDX;
  do {
    lVar1 = *local_10;
    *local_10 = lVar1 + 1;
    local_19 = *(char *)(lVar1 + 1);
    bVar2 = internal::is_name_start<char>(local_19);
    if (!bVar2) {
      in_stack_ffffffffffffff96 = '/' < local_19 && local_19 < ':';
    }
    uVar3 = bVar2 || '/' < local_19 && local_19 < ':';
  } while ((bool)uVar3);
  local_28 = (char *)0x0;
  BasicStringRef<char>::BasicStringRef(&local_38,local_18,*local_10 - (long)local_18);
  get_arg(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_RSI);
  if (local_28 != (char *)0x0) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffc0,local_28);
    message.data_._6_1_ = in_stack_ffffffffffffff96;
    message.data_._0_6_ = in_stack_ffffffffffffff90;
    message.data_._7_1_ = uVar3;
    FormatError::FormatError(this_00,message);
    __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return in_RDI;
}

Assistant:

inline internal::Arg BasicFormatter<Char, AF>::parse_arg_name(const Char *&s) {
  assert(internal::is_name_start(*s));
  const Char *start = s;
  Char c;
  do {
    c = *++s;
  } while (internal::is_name_start(c) || ('0' <= c && c <= '9'));
  const char *error = 0;
  internal::Arg arg = get_arg(BasicStringRef<Char>(start, s - start), error);
  if (error)
    FMT_THROW(FormatError(error));
  return arg;
}